

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O2

void ostringstream_suite::test_empty(void)

{
  string local_1a0 [32];
  ostringstream output;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&output);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[1]>
            ("output.str()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x3c,"void ostringstream_suite::test_empty()",local_1a0,"");
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output);
  return;
}

Assistant:

void test_empty()
{
    std::ostringstream output;
    ostream_buffer<char> container(output);

    TRIAL_PROTOCOL_TEST_EQUAL(output.str(), "");
}